

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

_Bool cpu_restore_state_x86_64(CPUState *cpu,uintptr_t host_pc,_Bool will_exit)

{
  TCGContext_conflict6 *tcg_ctx_00;
  uint32_t uVar1;
  TranslationBlock *tb_00;
  uc_struct_conflict *uc;
  uintptr_t check_offset;
  _Bool r;
  TranslationBlock *tb;
  TCGContext *tcg_ctx;
  _Bool will_exit_local;
  uintptr_t host_pc_local;
  CPUState *cpu_local;
  
  tcg_ctx_00 = cpu->uc->tcg_ctx;
  check_offset._7_1_ = false;
  if ((host_pc - (long)cpu->uc->tcg_ctx->code_gen_buffer < cpu->uc->tcg_ctx->code_gen_buffer_size)
     && (tb_00 = tcg_tb_lookup_x86_64((TCGContext *)tcg_ctx_00,host_pc),
        tb_00 != (TranslationBlock *)0x0)) {
    cpu_restore_state_from_tb(cpu,tb_00,host_pc,will_exit);
    uVar1 = tb_cflags(tb_00);
    if ((uVar1 & 0x10000) != 0) {
      tb_phys_invalidate_x86_64((TCGContext *)tcg_ctx_00,tb_00,0xffffffffffffffff);
      tcg_tb_remove_x86_64((TCGContext *)tcg_ctx_00,tb_00);
    }
    check_offset._7_1_ = true;
  }
  return check_offset._7_1_;
}

Assistant:

bool cpu_restore_state(CPUState *cpu, uintptr_t host_pc, bool will_exit)
{
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    TranslationBlock *tb;
    bool r = false;
    uintptr_t check_offset;
    struct uc_struct *uc = cpu->uc;

    /* The host_pc has to be in the region of current code buffer. If
     * it is not we will not be able to resolve it here. The two cases
     * where host_pc will not be correct are:
     *
     *  - fault during translation (instruction fetch)
     *  - fault from helper (not using GETPC() macro)
     *
     * Either way we need return early as we can't resolve it here.
     *
     * We are using unsigned arithmetic so if host_pc <
     * tcg_init_ctx.code_gen_buffer check_offset will wrap to way
     * above the code_gen_buffer_size
     */
    check_offset = host_pc - (uintptr_t) uc->tcg_ctx->code_gen_buffer;

    if (check_offset < uc->tcg_ctx->code_gen_buffer_size) {
        tb = tcg_tb_lookup(tcg_ctx, host_pc);
        if (tb) {
            cpu_restore_state_from_tb(cpu, tb, host_pc, will_exit);
            if (tb_cflags(tb) & CF_NOCACHE) {
                /* one-shot translation, invalidate it immediately */
                tb_phys_invalidate(tcg_ctx, tb, -1);
                tcg_tb_remove(tcg_ctx, tb);
            }
            r = true;
        }
    }

    return r;
}